

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-lore.c
# Opt level: O2

void lore_do_probe(monster *mon)

{
  byte *pbVar1;
  monster_lore *lore;
  
  lore = get_lore(mon->race);
  lore->all_known = true;
  lore_update(mon->race,lore);
  if (player->upkeep->monster_race == mon->race) {
    pbVar1 = (byte *)((long)&player->upkeep->redraw + 2);
    *pbVar1 = *pbVar1 | 0x10;
  }
  return;
}

Assistant:

void lore_do_probe(struct monster *mon)
{
	struct monster_lore *lore = get_lore(mon->race);
	
	lore->all_known = true;
	lore_update(mon->race, lore);

	/* Update monster recall window */
	if (player->upkeep->monster_race == mon->race)
		player->upkeep->redraw |= (PR_MONSTER);
}